

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void array_container_add_range_nvals
               (array_container_t *array,uint32_t min,uint32_t max,int32_t nvals_less,
               int32_t nvals_greater)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  uint32_t i;
  int32_t union_cardinality;
  uint local_20;
  
  iVar1 = in_ECX + (in_EDX - in_ESI) + 1 + in_R8D;
  if (in_RDI[1] < iVar1) {
    array_container_grow
              ((array_container_t *)CONCAT44(in_ESI,in_EDX),in_ECX,SUB41((uint)in_R8D >> 0x18,0));
  }
  memmove((void *)(*(long *)(in_RDI + 2) + (long)(iVar1 - in_R8D) * 2),
          (void *)(*(long *)(in_RDI + 2) + (long)(*in_RDI - in_R8D) * 2),(long)in_R8D << 1);
  for (local_20 = 0; local_20 <= (uint)(in_EDX - in_ESI); local_20 = local_20 + 1) {
    *(short *)(*(long *)(in_RDI + 2) + (ulong)(in_ECX + local_20) * 2) =
         (short)in_ESI + (short)local_20;
  }
  *in_RDI = iVar1;
  return;
}

Assistant:

static inline void array_container_add_range_nvals(array_container_t *array,
                                                   uint32_t min, uint32_t max,
                                                   int32_t nvals_less,
                                                   int32_t nvals_greater) {
    int32_t union_cardinality = nvals_less + (max - min + 1) + nvals_greater;
    if (union_cardinality > array->capacity) {
        array_container_grow(array, union_cardinality, true);
    }
    memmove(&(array->array[union_cardinality - nvals_greater]),
            &(array->array[array->cardinality - nvals_greater]),
            nvals_greater * sizeof(uint16_t));
    for (uint32_t i = 0; i <= max - min; i++) {
        array->array[nvals_less + i] = (uint16_t)(min + i);
    }
    array->cardinality = union_cardinality;
}